

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRectFilled
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,
          ImDrawCornerFlags rounding_corners)

{
  ImDrawCornerFlags rounding_corners_local;
  float rounding_local;
  ImU32 col_local;
  ImVec2 *p_max_local;
  ImVec2 *p_min_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    if (rounding <= 0.0) {
      PrimReserve(this,6,4);
      PrimRect(this,p_min,p_max,col);
    }
    else {
      PathRect(this,p_min,p_max,rounding,rounding_corners);
      PathFillConvex(this,col);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilled(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawCornerFlags rounding_corners)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (rounding > 0.0f)
    {
        PathRect(p_min, p_max, rounding, rounding_corners);
        PathFillConvex(col);
    }
    else
    {
        PrimReserve(6, 4);
        PrimRect(p_min, p_max, col);
    }
}